

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fight.c
# Opt level: O1

void do_nerve(CHAR_DATA *ch,char *argument)

{
  short sVar1;
  short sVar2;
  bool bVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  CClass *this;
  CHAR_DATA *victim;
  char *pcVar9;
  long lVar10;
  AFFECT_DATA af;
  char arg [4608];
  char buf [4608];
  AFFECT_DATA local_24a0;
  char local_2438 [4608];
  char local_1238 [4616];
  
  iVar4 = get_skill(ch,(int)gsn_nerve);
  if (iVar4 != 0) {
    sVar1 = ch->level;
    lVar10 = (long)gsn_nerve;
    this = ch->my_class;
    if ((this == (CClass *)0x0) &&
       ((ch->pIndexData == (MOB_INDEX_DATA *)0x0 ||
        (this = ch->pIndexData->my_class, this == (CClass *)0x0)))) {
      this = CClass::GetClass(0);
    }
    iVar5 = CClass::GetIndex(this);
    if (*(short *)(lVar10 * 0x60 + 0x45a788 + (long)iVar5 * 2) <= sVar1) {
      one_argument(argument,local_2438);
      if (local_2438[0] == '\0') {
        victim = ch->fighting;
      }
      else {
        victim = get_char_room(ch,local_2438);
      }
      if (victim == (CHAR_DATA *)0x0) {
        pcVar9 = "Attempt to put pressure on who\'s nerves?\n\r";
      }
      else if (victim == ch) {
        pcVar9 = "You can\'t do that.\n\r";
      }
      else {
        bVar3 = is_safe_new(ch,victim,true);
        if (bVar3) {
          return;
        }
        bVar3 = is_affected(victim,(int)gsn_nerve);
        if (!bVar3) {
          sVar1 = ch->level;
          sVar2 = victim->level;
          iVar5 = get_curr_stat(victim,3);
          iVar6 = get_curr_stat(ch,3);
          iVar7 = get_curr_stat(victim,4);
          iVar8 = number_percent();
          if (((float)(iVar6 / 2) +
              (((float)(((int)sVar1 - (int)sVar2) * 3) + (float)iVar4) - (float)(iVar5 / 3))) -
              (float)(iVar7 / 3) < (float)iVar8) {
            act("$n grasps $N\'s arm but fails to apply the right pressure point.",ch,(void *)0x0,
                victim,1);
            act("You grasp $N\'s arm but fail to apply the right pressure point.",ch,(void *)0x0,
                victim,3);
            act("$n grasps your arm but fails to apply the right pressure point.",ch,(void *)0x0,
                victim,2);
            check_improve(ch,(int)gsn_nerve,false,3);
            WAIT_STATE(ch,0xc);
            return;
          }
          act("$n grasps $N\'s arm and weakens $m with pressure points.",ch,(void *)0x0,victim,1);
          act("You grasp $N\'s arm and weaken $m with pressure points.",ch,(void *)0x0,victim,3);
          act("$n grasps your arm and weakens you with pressure point.",ch,(void *)0x0,victim,2);
          check_improve(ch,(int)gsn_nerve,true,3);
          init_affect(&local_24a0);
          local_24a0.where = 0;
          local_24a0.type = gsn_nerve;
          local_24a0.location = 1;
          local_24a0.level = ch->level;
          local_24a0.duration = local_24a0.level / 5;
          local_24a0.modifier = -3;
          local_24a0.aftype = 1;
          affect_to_char(victim,&local_24a0);
          WAIT_STATE(ch,0xc);
          bVar3 = is_npc(ch);
          if (((!bVar3) && (bVar3 = is_npc(victim), !bVar3)) &&
             ((ch->fighting == (CHAR_DATA *)0x0 || (victim->fighting == (CHAR_DATA *)0x0)))) {
            pcVar9 = pers(ch,victim);
            sprintf(local_1238,"Help, %s is attacking me!",pcVar9);
            do_myell(victim,local_1238,ch);
          }
          if (victim->fighting != (CHAR_DATA *)0x0) {
            return;
          }
          multi_hit(victim,ch,-1);
          return;
        }
        pcVar9 = "They have already been weakened using nerve pressure.\n\r";
      }
      send_to_char(pcVar9,ch);
      return;
    }
  }
  send_to_char("You don\'t know how to use nerve pressure tactics.\n\r",ch);
  return;
}

Assistant:

void do_nerve(CHAR_DATA *ch, char *argument)
{
	char buf[MAX_STRING_LENGTH];
	CHAR_DATA *victim;
	char arg[MAX_INPUT_LENGTH];
	AFFECT_DATA af;
	float chance;

	chance = get_skill(ch, gsn_nerve);

	if (chance == 0 
		|| ch->level < skill_table[gsn_nerve].skill_level[ch->Class()->GetIndex()])
	{
		send_to_char("You don't know how to use nerve pressure tactics.\n\r", ch);
		return;
	}

	one_argument(argument, arg);

	if (arg[0] == '\0')
		victim = ch->fighting;
	else
		victim = get_char_room(ch, arg);

	if (victim == nullptr)
	{
		send_to_char("Attempt to put pressure on who's nerves?\n\r", ch);
		return;
	}

	if (victim == ch)
	{
		send_to_char("You can't do that.\n\r", ch);
		return;
	}

	if (is_safe(ch, victim))
		return;

	if (is_affected(victim, gsn_nerve))
	{
		send_to_char("They have already been weakened using nerve pressure.\n\r", ch);
		return;
	}

	chance += (ch->level - victim->level) * 3;
	chance -= get_curr_stat(victim, STAT_DEX) / 3;
	chance += get_curr_stat(ch, STAT_DEX) / 2;
	chance -= get_curr_stat(victim, STAT_CON) / 3;

	if (number_percent() > chance)
	{
		act("$n grasps $N's arm but fails to apply the right pressure point.", ch, 0, victim, TO_NOTVICT);
		act("You grasp $N's arm but fail to apply the right pressure point.", ch, 0, victim, TO_CHAR);
		act("$n grasps your arm but fails to apply the right pressure point.", ch, 0, victim, TO_VICT);

		check_improve(ch, gsn_nerve, false, 3);
		WAIT_STATE(ch, PULSE_VIOLENCE);
		return;
	}
	else
	{
		act("$n grasps $N's arm and weakens $m with pressure points.", ch, 0, victim, TO_NOTVICT);
		act("You grasp $N's arm and weaken $m with pressure points.", ch, 0, victim, TO_CHAR);
		act("$n grasps your arm and weakens you with pressure point.", ch, 0, victim, TO_VICT);
		check_improve(ch, gsn_nerve, true, 3);

		init_affect(&af);
		af.where = TO_AFFECTS;
		af.type = gsn_nerve;
		af.location = APPLY_STR;
		af.duration = (ch->level / 5);
		af.modifier = -3;
		af.aftype = AFT_SKILL;
		af.level = ch->level;
		affect_to_char(victim, &af);

		WAIT_STATE(ch, PULSE_VIOLENCE);
	}

	if (!is_npc(ch) && !is_npc(victim) && (ch->fighting == nullptr || victim->fighting == nullptr))
	{
		sprintf(buf, "Help, %s is attacking me!", pers(ch, victim));
		do_myell(victim, buf, ch);
	}

	if (victim->fighting == nullptr)
	{
		multi_hit(victim, ch, TYPE_UNDEFINED);
	}
}